

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void SetUserVariable(AActor *self,FName *varname,int index,int value)

{
  bool bVar1;
  PType *type;
  void *addr;
  PType *local_28;
  void *local_20;
  FName local_14;
  
  local_14 = (FName)varname->Index;
  bVar1 = GetVarAddrType(self,&local_14,index,&local_20,&local_28,false);
  if (!bVar1) {
    return;
  }
  bVar1 = DObject::IsKindOf((DObject *)local_28,PFloat::RegistrationInfo.MyClass);
  if (bVar1) {
    (*(local_28->super_PTypeBase).super_DObject._vptr_DObject[0x10])
              ((double)value * 1.52587890625e-05,local_28);
    return;
  }
  (*(local_28->super_PTypeBase).super_DObject._vptr_DObject[0xf])
            (local_28,local_20,(ulong)(uint)value);
  return;
}

Assistant:

static void SetUserVariable(AActor *self, FName varname, int index, int value)
{
	void *addr;
	PType *type;

	if (GetVarAddrType(self, varname, index, addr, type, false))
	{
		if (!type->IsKindOf(RUNTIME_CLASS(PFloat)))
		{
			type->SetValue(addr, value);
		}
		else
		{
			type->SetValue(addr, ACSToDouble(value));
		}
	}
}